

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

void __thiscall Js::ProbeContainer::RemoveAllProbes(ProbeContainer *this)

{
  int iVar1;
  Type *ppPVar2;
  int local_14;
  int i;
  ProbeContainer *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = JsUtil::ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                      (&this->diagProbeList->
                        super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>);
    if (iVar1 <= local_14) break;
    ppPVar2 = JsUtil::
              List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this->diagProbeList,local_14);
    (*((*ppPVar2)->super_HaltCallback)._vptr_HaltCallback[6])(*ppPVar2,0);
    local_14 = local_14 + 1;
  }
  JsUtil::List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  Clear(this->diagProbeList);
  return;
}

Assistant:

void ProbeContainer::RemoveAllProbes()
    {
#ifdef ENABLE_MUTATION_BREAKPOINT
        if (HasMutationBreakpoints())
        {
            ClearMutationBreakpoints();
        }
#endif
        for (int i = 0; i < diagProbeList->Count(); i++)
        {
            diagProbeList->Item(i)->Uninstall(nullptr);
        }
        diagProbeList->Clear();
    }